

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_link_utf8(archive_entry *entry,char *target)

{
  int *piVar1;
  wchar_t local_24;
  wchar_t r;
  char *target_local;
  archive_entry *entry_local;
  
  if ((entry->ae_set & 2U) == 0) {
    local_24 = archive_mstring_update_utf8(entry->archive,&entry->ae_hardlink,target);
  }
  else {
    local_24 = archive_mstring_update_utf8(entry->archive,&entry->ae_symlink,target);
  }
  if (local_24 == L'\0') {
    entry_local._4_4_ = L'\x01';
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 == 0xc) {
      __archive_errx(1,"No memory");
    }
    entry_local._4_4_ = L'\0';
  }
  return entry_local._4_4_;
}

Assistant:

int
archive_entry_update_link_utf8(struct archive_entry *entry, const char *target)
{
	int r;
	if (entry->ae_set & AE_SET_SYMLINK)
		r = archive_mstring_update_utf8(entry->archive,
		    &entry->ae_symlink, target);
	else
		r = archive_mstring_update_utf8(entry->archive,
		    &entry->ae_hardlink, target);
	if (r == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}